

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslateEH.cpp
# Opt level: O3

Index __thiscall
wasm::anon_unknown_157::TranslateToExnref::getScratchLocal(TranslateToExnref *this,Type type)

{
  undefined1 auVar1 [16];
  Index IVar2;
  Type in_R8;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Type,_unsigned_int>,_false,_true>,_bool>
  pVar3;
  
  pVar3 = std::
          _Hashtable<wasm::Type,std::pair<wasm::Type_const,unsigned_int>,std::allocator<std::pair<wasm::Type_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<wasm::Type_const,unsigned_int>>
                    ((_Hashtable<wasm::Type,std::pair<wasm::Type_const,unsigned_int>,std::allocator<std::pair<wasm::Type_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->typeToScratchLocal);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    IVar2 = *(Index *)((long)pVar3.first.
                             super__Node_iterator_base<std::pair<const_wasm::Type,_unsigned_int>,_true>
                             ._M_cur.
                             super__Node_iterator_base<std::pair<const_wasm::Type,_unsigned_int>,_true>
                      + 0x10);
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = type.id;
    IVar2 = Builder::addVar((Builder *)
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>_>
                            ).
                            super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
                            .currFunction,(Function *)0x0,(Name)(auVar1 << 0x40),in_R8);
    *(Index *)((long)pVar3.first.
                     super__Node_iterator_base<std::pair<const_wasm::Type,_unsigned_int>,_true>.
                     _M_cur.
                     super__Node_iterator_base<std::pair<const_wasm::Type,_unsigned_int>,_true> +
              0x10) = IVar2;
  }
  return IVar2;
}

Assistant:

Index getScratchLocal(Type type) {
    auto [it, inserted] = typeToScratchLocal.insert({type, 0});
    if (inserted) {
      it->second = Builder::addVar(getFunction(), type);
    }
    return it->second;
  }